

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

void steal_it(monst *mdef,attack *mattk)

{
  obj **ppoVar1;
  obj **ppoVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  obj *poVar7;
  char local_138 [8];
  char kbuf [256];
  long unwornmask;
  obj **minvent_ptr;
  obj *stealoid;
  obj *otmp;
  attack *mattk_local;
  monst *mdef_local;
  
  if (mdef->minvent != (obj *)0x0) {
    minvent_ptr = (obj **)0x0;
    iVar3 = could_seduce(&youmonst,mdef,mattk);
    if (iVar3 != 0) {
      ppoVar2 = &mdef->minvent;
      while (unwornmask = (long)ppoVar2, ppoVar1 = *(obj ***)unwornmask, ppoVar1 != (obj **)0x0) {
        ppoVar2 = ppoVar1;
        if (((ulong)ppoVar1[0xc] & 1) != 0) {
          if (minvent_ptr != (obj **)0x0) {
            panic("steal_it: multiple worn suits");
          }
          *(obj **)unwornmask = *ppoVar1;
          *ppoVar1 = (obj *)0x0;
          ppoVar2 = (obj **)unwornmask;
          minvent_ptr = ppoVar1;
        }
      }
      *(obj ***)unwornmask = minvent_ptr;
    }
    if (minvent_ptr != (obj **)0x0) {
      uVar4 = gender(mdef);
      if ((uVar4 == ((byte)u._1052_1_ >> 3 & 1)) && ((youmonst.data)->mlet == '\x0e')) {
        pcVar5 = mon_nam(mdef);
        pline("You charm %s.  She gladly hands over her possessions.",pcVar5);
      }
      else {
        pcVar6 = mon_nam(mdef);
        iVar3 = pronoun_gender(level,mdef);
        pcVar5 = genders[iVar3].he;
        iVar3 = pronoun_gender(level,mdef);
        pline("You seduce %s and %s starts to take off %s clothes.",pcVar6,pcVar5,genders[iVar3].his
             );
      }
    }
    do {
      do {
        poVar7 = mdef->minvent;
        if (poVar7 == (obj *)0x0) {
          return;
        }
        if (u.umonnum == u.umonster) {
          return;
        }
        obj_extract_self(poVar7);
        kbuf._248_8_ = SEXT48(poVar7->owornmask);
        if (kbuf._248_8_ != 0) {
          mdef->misc_worn_check = mdef->misc_worn_check & (poVar7->owornmask ^ 0xffffffffU);
          if ((poVar7->owornmask & 0x100U) != 0) {
            setmnotwielded(mdef,poVar7);
            mdef->mw = (obj *)0x0;
          }
          poVar7->owornmask = 0;
          update_mon_intrinsics(level,mdef,poVar7,'\0','\0');
          if (poVar7 == (obj *)minvent_ptr) {
            pcVar5 = Monnam(mdef);
            iVar3 = pronoun_gender(level,mdef);
            pline("%s finishes taking off %s suit.",pcVar5,genders[iVar3].his);
          }
        }
        pcVar5 = doname(poVar7);
        poVar7 = hold_another_object(poVar7,"You snatched but dropped %s.",pcVar5,"You steal: ");
      } while (poVar7->where != '\x03');
      if ((poVar7->otyp == 0x10e) &&
         (((((long)poVar7->corpsenm & 0x3ffffffffffffffU) == 0xc ||
           (((long)poVar7->corpsenm & 0x3ffffffffffffffU) == 0xb)) && (uarmg == (obj *)0x0)))) {
        pcVar5 = mons_mname(mons + poVar7->corpsenm);
        sprintf(local_138,"a stolen %s corpse",pcVar5);
        delayed_petrify((char *)0x0,local_138);
        return;
      }
      if ((kbuf._248_8_ & 0x100) == 0) {
        if (((kbuf._248_8_ & 0x10) != 0) && (mselftouch(mdef,(char *)0x0,'\x01'), mdef->mhp < 1)) {
          return;
        }
      }
      else {
        possibly_unwield(mdef,'\0');
      }
    } while (minvent_ptr != (obj **)0x0);
  }
  return;
}

Assistant:

static void steal_it(struct monst *mdef, const struct attack *mattk)
{
	struct obj *otmp, *stealoid, **minvent_ptr;
	long unwornmask;

	if (!mdef->minvent) return;		/* nothing to take */

	/* look for worn body armor */
	stealoid = NULL;
	if (could_seduce(&youmonst, mdef, mattk)) {
	    /* find armor, and move it to end of inventory in the process */
	    minvent_ptr = &mdef->minvent;
	    while ((otmp = *minvent_ptr) != 0)
		if (otmp->owornmask & W_ARM) {
		    if (stealoid) panic("steal_it: multiple worn suits");
		    *minvent_ptr = otmp->nobj;	/* take armor out of minvent */
		    stealoid = otmp;
		    stealoid->nobj = NULL;
		} else {
		    minvent_ptr = &otmp->nobj;
		}
	    *minvent_ptr = stealoid;	/* put armor back into minvent */
	}

	if (stealoid) {		/* we will be taking everything */
	    if (gender(mdef) == (int) u.mfemale &&
			youmonst.data->mlet == S_NYMPH)
		pline("You charm %s.  She gladly hands over her possessions.",
		    mon_nam(mdef));
	    else
		pline("You seduce %s and %s starts to take off %s clothes.",
		    mon_nam(mdef), mhe(level, mdef), mhis(level, mdef));
	}

	while ((otmp = mdef->minvent) != 0) {
	    if (!Upolyd) break;		/* no longer have ability to steal */
	    /* take the object away from the monster */
	    obj_extract_self(otmp);
	    if ((unwornmask = otmp->owornmask) != 0L) {
		mdef->misc_worn_check &= ~unwornmask;
		if (otmp->owornmask & W_WEP) {
		    setmnotwielded(mdef,otmp);
		    MON_NOWEP(mdef);
		}
		otmp->owornmask = 0L;
		update_mon_intrinsics(level, mdef, otmp, FALSE, FALSE);

		if (otmp == stealoid)	/* special message for final item */
		    pline("%s finishes taking off %s suit.",
			  Monnam(mdef), mhis(level, mdef));
	    }
	    /* give the object to the character */
	    otmp = hold_another_object(otmp, "You snatched but dropped %s.",
				       doname(otmp), "You steal: ");
	    if (otmp->where != OBJ_INVENT) continue;
	    if (otmp->otyp == CORPSE &&
		    touch_petrifies(&mons[otmp->corpsenm]) && !uarmg) {
		char kbuf[BUFSZ];

		sprintf(kbuf, "a stolen %s corpse", mons_mname(&mons[otmp->corpsenm]));
		delayed_petrify(NULL, kbuf);
		break;		/* stop the theft even if hero survives */
	    }
	    /* more take-away handling, after theft message */
	    if (unwornmask & W_WEP) {		/* stole wielded weapon */
		possibly_unwield(mdef, FALSE);
	    } else if (unwornmask & W_ARMG) {	/* stole worn gloves */
		mselftouch(mdef, NULL, TRUE);
		if (mdef->mhp <= 0)	/* it's now a statue */
		    return;		/* can't continue stealing */
	    }

	    if (!stealoid) break;	/* only taking one item */
	}
}